

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerCPP::variable_decl
          (string *__return_storage_ptr__,CompilerCPP *this,SPIRType *type,string *name,
          uint32_t param_3)

{
  char (*ts_4) [2];
  char (*pacVar1) [2];
  bool *pbVar2;
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  uint *local_70;
  uint *array;
  byte local_5d;
  uint32_t i;
  bool runtime;
  undefined1 local_50 [8];
  string base;
  uint32_t param_3_local;
  string *name_local;
  SPIRType *type_local;
  CompilerCPP *this_local;
  
  base.field_2._12_4_ = param_3;
  (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])((string *)local_50,this,type,0);
  Compiler::remap_variable_type_name((Compiler *)this,type,name,(string *)local_50);
  local_5d = 0;
  array._4_4_ = 0;
  do {
    ts_4 = (char (*) [2])(ulong)array._4_4_;
    pacVar1 = (char (*) [2])
              VectorView<unsigned_int>::size(&(type->array).super_VectorView<unsigned_int>);
    if (pacVar1 <= ts_4) {
      ::std::__cxx11::string::operator+=((string *)local_50,' ');
      ::std::operator+(&local_d0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,name);
      __rhs = "";
      if ((local_5d & 1) != 0) {
        __rhs = "[1]";
      }
      ::std::operator+(__return_storage_ptr__,&local_d0,__rhs);
      ::std::__cxx11::string::~string((string *)&local_d0);
      ::std::__cxx11::string::~string((string *)local_50);
      return __return_storage_ptr__;
    }
    local_70 = VectorView<unsigned_int>::operator[]
                         (&(type->array).super_VectorView<unsigned_int>,(ulong)array._4_4_);
    if (*local_70 == 0) {
      pbVar2 = VectorView<bool>::operator[]
                         (&(type->array_size_literal).super_VectorView<bool>,(ulong)array._4_4_);
      if ((*pbVar2 & 1U) == 0) goto LAB_004463fa;
      local_5d = 1;
    }
    else {
LAB_004463fa:
      CompilerGLSL::to_array_size_abi_cxx11_(&local_b0,&this->super_CompilerGLSL,type,array._4_4_);
      join<char_const(&)[12],std::__cxx11::string&,char_const(&)[3],std::__cxx11::string,char_const(&)[2]>
                (&local_90,(spirv_cross *)"std::array<",(char (*) [12])local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a8753,
                 (char (*) [3])&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x5a981b,ts_4)
      ;
      ::std::__cxx11::string::operator=((string *)local_50,(string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      ::std::__cxx11::string::~string((string *)&local_b0);
    }
    array._4_4_ = array._4_4_ + 1;
  } while( true );
}

Assistant:

string CompilerCPP::variable_decl(const SPIRType &type, const string &name, uint32_t /* id */)
{
	string base = type_to_glsl(type);
	remap_variable_type_name(type, name, base);
	bool runtime = false;

	for (uint32_t i = 0; i < type.array.size(); i++)
	{
		auto &array = type.array[i];
		if (!array && type.array_size_literal[i])
		{
			// Avoid using runtime arrays with std::array since this is undefined.
			// Runtime arrays cannot be passed around as values, so this is fine.
			runtime = true;
		}
		else
			base = join("std::array<", base, ", ", to_array_size(type, i), ">");
	}
	base += ' ';
	return base + name + (runtime ? "[1]" : "");
}